

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

int luaU_dump(lua_State *L,Proto *f,lua_Writer w,void *data,int strip)

{
  lu_byte x;
  DumpState D;
  long local_38;
  DumpState local_30;
  
  local_30.status = 0;
  local_30.L = L;
  local_30.writer = w;
  local_30.data = data;
  local_30.strip = strip;
  local_30.status = (*w)(L,"\x1bLua",4,data);
  local_38._0_1_ = 0x53;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  local_38 = (ulong)local_38._1_7_ << 8;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,anon_var_dwarf_c3f2,6,local_30.data);
  }
  local_38._0_1_ = 4;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  local_38._0_1_ = 8;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  local_38._0_1_ = 4;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  local_38._0_1_ = 8;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  local_38 = CONCAT71(local_38._1_7_,8);
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  local_38 = 0x5678;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,8,local_30.data);
  }
  local_38 = 0x4077280000000000;
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,8,local_30.data);
  }
  local_38 = CONCAT71(local_38._1_7_,(char)f->sizeupvalues);
  if (local_30.status == 0) {
    local_30.status = (*local_30.writer)(local_30.L,&local_38,1,local_30.data);
  }
  DumpFunction(f,(TString *)0x0,&local_30);
  return local_30.status;
}

Assistant:

int luaU_dump(lua_State *L, const Proto *f, lua_Writer w, void *data,
              int strip) {
    DumpState D;
    D.L = L;
    D.writer = w;
    D.data = data;
    D.strip = strip;
    D.status = 0;
    DumpHeader(&D);
    DumpByte(f->sizeupvalues, &D);
    DumpFunction(f, NULL, &D);
    return D.status;
}